

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O1

char * Sto_ManMemoryFetch(Sto_Man_t *p,int nBytes)

{
  int iVar1;
  char *pcVar2;
  long *plVar3;
  
  pcVar2 = p->pChunkLast;
  if ((pcVar2 == (char *)0x0) || (p->nChunkSize - p->nChunkUsed < nBytes)) {
    plVar3 = (long *)malloc((long)p->nChunkSize);
    *plVar3 = (long)pcVar2;
    p->pChunkLast = (char *)plVar3;
    p->nChunkUsed = 8;
  }
  iVar1 = p->nChunkUsed;
  p->nChunkUsed = nBytes + iVar1;
  return p->pChunkLast + iVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Fetches memory.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
char * Sto_ManMemoryFetch( Sto_Man_t * p, int nBytes )
{
    char * pMem;
    if ( p->pChunkLast == NULL || nBytes > p->nChunkSize - p->nChunkUsed )
    {
        pMem = (char *)ABC_ALLOC( char, p->nChunkSize );
        *(char **)pMem = p->pChunkLast;
        p->pChunkLast = pMem;
        p->nChunkUsed = sizeof(char *);
    }
    pMem = p->pChunkLast + p->nChunkUsed;
    p->nChunkUsed += nBytes;
    return pMem;
}